

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrator.cpp
# Opt level: O0

Spectrum * __thiscall
phyr::SamplerIntegrator::specularReflect
          (SamplerIntegrator *this,Ray *ray,SurfaceInteraction *isect,Scene *scene,Sampler *sampler,
          MemoryPool *pool,int depth)

{
  bool bVar1;
  long in_RCX;
  Vector3f *in_RSI;
  Spectrum *in_RDI;
  undefined8 in_R8;
  long *in_R9;
  int iVar2;
  double dVar3;
  undefined8 in_stack_00000008;
  int in_stack_00000010;
  Ray rd;
  Normal3f *ns;
  Spectrum f;
  BxDFType type;
  double pdf;
  Vector3f wi;
  Vector3f wo;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffff5bc;
  Vector3<double> *v;
  Interaction *this_00;
  undefined1 local_a18 [1592];
  double *in_stack_fffffffffffffc20;
  Point2f *in_stack_fffffffffffffc28;
  Vector3f *in_stack_fffffffffffffc30;
  Vector3f *in_stack_fffffffffffffc38;
  BSDF *in_stack_fffffffffffffc40;
  BxDFType in_stack_fffffffffffffc50;
  BxDFType *in_stack_fffffffffffffc58;
  undefined1 local_298 [56];
  long local_260;
  undefined8 local_258;
  CoefficientSpectrum<60> local_248;
  undefined4 local_64;
  double local_60;
  Vector3<double> local_58;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  long *local_28;
  undefined8 local_20;
  long local_18;
  
  local_40 = *(undefined8 *)(in_RCX + 0x30);
  local_38 = *(undefined8 *)(in_RCX + 0x38);
  local_30 = *(undefined8 *)(in_RCX + 0x40);
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  Vector3<double>::Vector3(&local_58);
  local_64 = 0x11;
  this_00 = *(Interaction **)(local_18 + 0xd0);
  local_258 = (**(code **)(*local_28 + 0x28))();
  v = (Vector3<double> *)0x0;
  uVar4 = local_64;
  BSDF::sample_f(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                 in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc58);
  local_260 = local_18 + 0x138;
  if ((0.0 < local_60) && (bVar1 = CoefficientSpectrum<60>::isBlack(&local_248), !bVar1)) {
    dVar3 = absDot<double>(v,(Normal3<double> *)CONCAT44(in_stack_fffffffffffff5bc,uVar4));
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      Interaction::emitRay(this_00,in_RSI);
      iVar2 = in_stack_00000010 + 1;
      (**(code **)((long)in_RSI->x + 0x20))
                (local_a18,in_RSI,local_298,local_20,local_28,in_stack_00000008);
      CoefficientSpectrum<60>::operator*
                ((CoefficientSpectrum<60> *)this_00,(CoefficientSpectrum<60> *)in_RSI);
      absDot<double>(v,(Normal3<double> *)CONCAT44(in_stack_fffffffffffff5bc,iVar2));
      CoefficientSpectrum<60>::operator*((CoefficientSpectrum<60> *)this_00,(double)in_RSI);
      CoefficientSpectrum<60>::operator/((CoefficientSpectrum<60> *)this_00,(double)in_RSI);
      SampledSpectrum::SampledSpectrum
                ((SampledSpectrum *)v,
                 (CoefficientSpectrum<60> *)CONCAT44(in_stack_fffffffffffff5bc,iVar2));
      return in_RDI;
    }
  }
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)v,(double)CONCAT44(in_stack_fffffffffffff5bc,uVar4));
  return in_RDI;
}

Assistant:

Spectrum SamplerIntegrator::specularReflect(const Ray& ray,
                                            const SurfaceInteraction& isect,
                                            const Scene& scene, Sampler& sampler,
                                            MemoryPool& pool, int depth) const {
    // Compute specular reflection direction _wi_ and BSDF value
    Vector3f wo = isect.wo, wi;
    Real pdf;
    BxDFType type = BxDFType(BSDF_REFLECTION | BSDF_SPECULAR);
    Spectrum f = isect.bsdf->sample_f(wo, &wi, sampler.getNextSample2D(), &pdf, type);

    // Return contribution of specular reflection
    const Normal3f &ns = isect.shadingGeom.n;
    if (pdf > 0.f && !f.isBlack() && absDot(wi, ns) != 0.f) {
        // Compute ray differential _rd_ for specular reflection
        Ray rd = isect.emitRay(wi);

// @todo: Uncomment once RayDifferentials are implemented
#if 0
        if (ray.hasDifferentials) {
            rd.hasDifferentials = true;
            rd.rxOrigin = isect.p + isect.dpdx;
            rd.ryOrigin = isect.p + isect.dpdy;
            // Compute differential reflected directions
            Normal3f dndx = isect.shading.dndu * isect.dudx +
                            isect.shading.dndv * isect.dvdx;
            Normal3f dndy = isect.shading.dndu * isect.dudy +
                            isect.shading.dndv * isect.dvdy;
            Vector3f dwodx = -ray.rxDirection - wo,
                     dwody = -ray.ryDirection - wo;
            Float dDNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dDNdy = Dot(dwody, ns) + Dot(wo, dndy);
            rd.rxDirection =
                wi - dwodx + 2.f * Vector3f(Dot(wo, ns) * dndx + dDNdx * ns);
            rd.ryDirection =
                wi - dwody + 2.f * Vector3f(Dot(wo, ns) * dndy + dDNdy * ns);
        }
#endif
        return f * li(rd, scene, sampler, pool, depth + 1) * absDot(wi, ns) / pdf;
    } else { return Spectrum(0.f); }
}